

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

Status __thiscall leveldb::VersionSet::LogAndApply(VersionSet *this,VersionEdit *edit,Mutex *mu)

{
  pointer ppVar1;
  __pthread_internal_list *p_Var2;
  long lVar3;
  Logger *info_log;
  Env *pEVar4;
  long *plVar5;
  undefined8 uVar6;
  int iVar7;
  Version *v;
  _Base_ptr p_Var8;
  pthread_mutex_t *in_RCX;
  VersionSet *this_00;
  string record;
  string new_manifest_file;
  undefined1 local_218 [32];
  undefined8 local_1f8;
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [8];
  Env *local_1c8;
  _Alloc_hider local_1c0;
  undefined1 local_1b8;
  
  if (mu[1].mu_.super___mutex_base._M_mutex.__size[0x19] == '\x01') {
    ppVar1 = (pointer)(mu->mu_).super___mutex_base._M_mutex.__data.__list.__next;
    if (ppVar1 < *(pointer *)&(edit->deleted_files_)._M_t._M_impl) {
      __assert_fail("edit->log_number_ >= log_number_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                    ,0x30b,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
    if ((edit->compact_pointers_).
        super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
        ._M_impl.super__Vector_impl_data._M_start <= ppVar1) {
      __assert_fail("edit->log_number_ < next_file_number_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                    ,0x30c,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
  }
  else {
    p_Var2 = *(__pthread_internal_list **)&(edit->deleted_files_)._M_t._M_impl;
    mu[1].mu_.super___mutex_base._M_mutex.__size[0x19] = '\x01';
    (mu->mu_).super___mutex_base._M_mutex.__data.__list.__next = p_Var2;
  }
  if (mu[1].mu_.super___mutex_base._M_mutex.__size[0x1a] == '\0') {
    lVar3 = *(long *)&(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header;
    mu[1].mu_.super___mutex_base._M_mutex.__size[0x1a] = '\x01';
    mu[1].mu_.super___mutex_base._M_mutex.__align = lVar3;
  }
  ppVar1 = (edit->compact_pointers_).
           super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  mu[1].mu_.super___mutex_base._M_mutex.__size[0x1b] = '\x01';
  *(pointer *)((long)&mu[1].mu_.super___mutex_base._M_mutex + 8) = ppVar1;
  ppVar1 = (edit->compact_pointers_).
           super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  mu[1].mu_.super___mutex_base._M_mutex.__size[0x1c] = '\x01';
  *(pointer *)((long)&mu[1].mu_.super___mutex_base._M_mutex + 0x10) = ppVar1;
  v = (Version *)operator_new(0xe8);
  v->vset_ = (VersionSet *)edit;
  v->next_ = v;
  v->prev_ = v;
  v->refs_ = 0;
  memset(v->files_,0,0xb0);
  v->file_to_compact_level_ = -1;
  v->compaction_score_ = -1.0;
  v->compaction_level_ = -1;
  this_00 = (VersionSet *)&stack0xfffffffffffffe38;
  Builder::Builder((Builder *)this_00,(VersionSet *)edit,
                   *(Version **)((long)&edit[2].comparator_.field_2 + 8));
  Builder::Apply((Builder *)this_00,(VersionEdit *)mu);
  Builder::SaveTo((Builder *)this_00,v);
  Builder::~Builder((Builder *)this_00);
  Finalize(this_00,v);
  local_1c8 = (Env *)&stack0xfffffffffffffe48;
  local_1c0._M_p = (pointer)0x0;
  local_1b8 = 0;
  if ((edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left == (_Base_ptr)0x0)
  {
    if ((edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)0x0) {
      __assert_fail("descriptor_file_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                    ,0x327,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
    DescriptorFileName((string *)local_218,(string *)&(edit->comparator_)._M_string_length,
                       (uint64_t)
                       (edit->compact_pointers_).
                       super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::operator=((string *)&stack0xfffffffffffffe38,(string *)local_218);
    if ((Env *)local_218._0_8_ != (Env *)(local_218 + 0x10)) {
      operator_delete((void *)local_218._0_8_);
    }
    ppVar1 = (edit->compact_pointers_).
             super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    mu[1].mu_.super___mutex_base._M_mutex.__size[0x1b] = '\x01';
    *(pointer *)((long)&mu[1].mu_.super___mutex_base._M_mutex + 8) = ppVar1;
    plVar5 = (long *)(edit->comparator_)._M_dataplus._M_p;
    (**(code **)(*plVar5 + 0x20))
              (local_218,plVar5,&stack0xfffffffffffffe38,
               &(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    this->env_ = (Env *)local_218._0_8_;
    if ((Env *)local_218._0_8_ != (Env *)0x0) {
      pthread_mutex_unlock(in_RCX);
      goto LAB_0011da60;
    }
    p_Var8 = (_Base_ptr)operator_new(0x20);
    log::Writer::Writer((Writer *)p_Var8,
                        (WritableFile *)
                        (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent);
    (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var8;
    WriteSnapshot((VersionSet *)local_218,(Writer *)edit);
    uVar6 = local_218._0_8_;
    this->env_ = (Env *)local_218._0_8_;
    pthread_mutex_unlock(in_RCX);
    if ((Env *)uVar6 != (Env *)0x0) goto LAB_0011da60;
  }
  else {
    pthread_mutex_unlock(in_RCX);
  }
  local_218._8_8_ = (pointer)0x0;
  local_218[0x10] = '\0';
  local_218._0_8_ = (Env *)(local_218 + 0x10);
  VersionEdit::EncodeTo((VersionEdit *)mu,(string *)local_218);
  local_1f0._0_8_ = local_218._0_8_;
  local_1f0._8_8_ = local_218._8_8_;
  log::Writer::AddRecord
            ((Writer *)local_1d0,
             (Slice *)(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  this->env_ = (Env *)local_1d0;
  if (local_1d0 == (undefined1  [8])0x0) {
    (**(code **)(*(long *)(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent + 0x28))(local_1f0);
    this->env_ = (Env *)local_1f0._0_8_;
    if ((Env *)local_1f0._0_8_ != (Env *)0x0) goto LAB_0011d8de;
  }
  else {
LAB_0011d8de:
    info_log = *(Logger **)(edit->prev_log_number_ + 0x18);
    Status::ToString_abi_cxx11_((string *)local_1f0,(Status *)this);
    Log(info_log,"MANIFEST write: %s\n",local_1f0._0_8_);
    if ((Env *)local_1f0._0_8_ != (Env *)(local_1f0 + 0x10)) {
      operator_delete((void *)local_1f0._0_8_);
    }
  }
  if ((Env *)local_218._0_8_ != (Env *)(local_218 + 0x10)) {
    operator_delete((void *)local_218._0_8_);
  }
  if ((this->env_ == (Env *)0x0) && (local_1c0._M_p != (pointer)0x0)) {
    SetCurrentFile((leveldb *)local_218,(Env *)(edit->comparator_)._M_dataplus._M_p,
                   (string *)&(edit->comparator_)._M_string_length,
                   (uint64_t)
                   (edit->compact_pointers_).
                   super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
    pEVar4 = this->env_;
    this->env_ = (Env *)local_218._0_8_;
    local_218._0_8_ = pEVar4;
    if (pEVar4 != (Env *)0x0) {
      operator_delete__(pEVar4);
    }
  }
LAB_0011da60:
  iVar7 = pthread_mutex_lock(in_RCX);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  if (this->env_ == (Env *)0x0) {
    AppendVersion((VersionSet *)edit,v);
    lVar3 = mu[1].mu_.super___mutex_base._M_mutex.__align;
    *(__pthread_internal_list **)&(edit->deleted_files_)._M_t._M_impl =
         (mu->mu_).super___mutex_base._M_mutex.__data.__list.__next;
    *(long *)&(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header = lVar3;
  }
  else {
    Version::~Version(v);
    operator_delete(v);
    if (local_1c0._M_p != (pointer)0x0) {
      p_Var8 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var8 != (_Base_ptr)0x0) {
        log::Writer::~Writer((Writer *)p_Var8);
      }
      operator_delete(p_Var8);
      p_Var8 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var8 != (_Base_ptr)0x0) {
        (**(code **)(*(long *)p_Var8 + 8))();
      }
      (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      plVar5 = (long *)(edit->comparator_)._M_dataplus._M_p;
      (**(code **)(*plVar5 + 0x40))(&local_1f8,plVar5,&stack0xfffffffffffffe38);
      if ((void *)local_1f8 != (void *)0x0) {
        operator_delete__((void *)local_1f8);
      }
    }
  }
  if (local_1c8 != (Env *)&stack0xfffffffffffffe48) {
    operator_delete(local_1c8);
  }
  return (Status)(char *)this;
}

Assistant:

Status VersionSet::LogAndApply(VersionEdit* edit, port::Mutex* mu) {
  if (edit->has_log_number_) {
    assert(edit->log_number_ >= log_number_);
    assert(edit->log_number_ < next_file_number_);
  } else {
    edit->SetLogNumber(log_number_);
  }

  if (!edit->has_prev_log_number_) {
    edit->SetPrevLogNumber(prev_log_number_);
  }

  edit->SetNextFile(next_file_number_);
  edit->SetLastSequence(last_sequence_);

  Version* v = new Version(this);
  {
    Builder builder(this, current_);
    builder.Apply(edit);
    builder.SaveTo(v);
  }
  Finalize(v);

  // Initialize new descriptor log file if necessary by creating
  // a temporary file that contains a snapshot of the current version.
  std::string new_manifest_file;
  Status s;
  if (descriptor_log_ == nullptr) {
    // No reason to unlock *mu here since we only hit this path in the
    // first call to LogAndApply (when opening the database).
    assert(descriptor_file_ == nullptr);
    new_manifest_file = DescriptorFileName(dbname_, manifest_file_number_);
    edit->SetNextFile(next_file_number_);
    s = env_->NewWritableFile(new_manifest_file, &descriptor_file_);
    if (s.ok()) {
      descriptor_log_ = new log::Writer(descriptor_file_);
      s = WriteSnapshot(descriptor_log_);
    }
  }

  // Unlock during expensive MANIFEST log write
  {
    mu->Unlock();

    // Write new record to MANIFEST log
    if (s.ok()) {
      std::string record;
      edit->EncodeTo(&record);
      s = descriptor_log_->AddRecord(record);
      if (s.ok()) {
        s = descriptor_file_->Sync();
      }
      if (!s.ok()) {
        Log(options_->info_log, "MANIFEST write: %s\n", s.ToString().c_str());
      }
    }

    // If we just created a new descriptor file, install it by writing a
    // new CURRENT file that points to it.
    if (s.ok() && !new_manifest_file.empty()) {
      s = SetCurrentFile(env_, dbname_, manifest_file_number_);
    }

    mu->Lock();
  }

  // Install the new version
  if (s.ok()) {
    AppendVersion(v);
    log_number_ = edit->log_number_;
    prev_log_number_ = edit->prev_log_number_;
  } else {
    delete v;
    if (!new_manifest_file.empty()) {
      delete descriptor_log_;
      delete descriptor_file_;
      descriptor_log_ = nullptr;
      descriptor_file_ = nullptr;
      env_->RemoveFile(new_manifest_file);
    }
  }

  return s;
}